

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_truetype.h
# Opt level: O0

void stbtt_GetFontBoundingBox(stbtt_fontinfo *info,int *x0,int *y0,int *x1,int *y1)

{
  stbtt_int16 sVar1;
  int *y1_local;
  int *x1_local;
  int *y0_local;
  int *x0_local;
  stbtt_fontinfo *info_local;
  
  sVar1 = ttSHORT(info->data + (long)info->head + 0x24);
  *x0 = (int)sVar1;
  sVar1 = ttSHORT(info->data + (long)info->head + 0x26);
  *y0 = (int)sVar1;
  sVar1 = ttSHORT(info->data + (long)info->head + 0x28);
  *x1 = (int)sVar1;
  sVar1 = ttSHORT(info->data + (long)info->head + 0x2a);
  *y1 = (int)sVar1;
  return;
}

Assistant:

STBTT_DEF void stbtt_GetFontBoundingBox(const stbtt_fontinfo *info, int *x0, int *y0, int *x1, int *y1)
{
   *x0 = ttSHORT(info->data + info->head + 36);
   *y0 = ttSHORT(info->data + info->head + 38);
   *x1 = ttSHORT(info->data + info->head + 40);
   *y1 = ttSHORT(info->data + info->head + 42);
}